

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int UTF8ToUTF16(uchar *outb,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  iVar4 = (int)outb;
  iVar5 = (int)in;
  if (in == (uchar *)0x0) {
    if (1 < *outlen) {
      outb[0] = 0xff;
      outb[1] = 0xfe;
      *outlen = 2;
      *inlen = 0;
      return 2;
    }
    *outlen = 0;
    *inlen = 0;
    return 0;
  }
  iVar1 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar5 = 0;
      iVar1 = 0;
    }
    else {
      if (0 < (long)*inlen) {
        pbVar6 = in + *inlen;
        pbVar2 = outb + ((long)*outlen & 0xfffffffffffffffe);
        iVar1 = -3;
        do {
          bVar9 = *in;
          if ((char)bVar9 < '\0') {
            if (bVar9 < 0xe0) {
              if (0xc1 < bVar9) {
                uVar13 = bVar9 & 0x1f;
                uVar11 = 0x80;
                lVar12 = 2;
                goto LAB_0012cae9;
              }
LAB_0012cb56:
              iVar3 = 4;
              iVar1 = -2;
            }
            else {
              lVar12 = 4 - (ulong)(bVar9 < 0xf0);
              uVar11 = 0x10000;
              if (bVar9 < 0xf0) {
                uVar11 = 0x800;
              }
              uVar13 = bVar9 & 0xf;
LAB_0012cae9:
              iVar3 = 3;
              if ((long)pbVar6 - (long)in < lVar12) goto LAB_0012cb5b;
              lVar7 = 1;
              do {
                uVar14 = uVar13;
                iVar3 = 4;
                if ((in[lVar7] & 0xc0) != 0x80) goto LAB_0012cb56;
                uVar10 = uVar14 << 6;
                uVar13 = in[lVar7] & 0x3f | uVar10;
                lVar7 = lVar7 + 1;
              } while (lVar12 != lVar7);
              if ((uVar13 < uVar11) || (0x10ffff < uVar10 || (uVar14 & 0x3ffffe0) == 0x360))
              goto LAB_0012cb56;
              bVar9 = (byte)(uVar10 >> 8);
              if (uVar10 < 0x10000) {
                if (outb < pbVar2) {
                  *outb = (byte)uVar13;
                  lVar8 = 2;
                  lVar7 = 1;
LAB_0012cbd6:
                  outb[lVar7] = bVar9;
                  outb = outb + lVar8;
                  in = in + lVar12;
                  iVar3 = 0;
                }
              }
              else if (3 < (long)pbVar2 - (long)outb) {
                *outb = (byte)(uVar13 - 0x10000 >> 10);
                outb[1] = (byte)(uVar13 - 0x10000 >> 0x12) | 0xd8;
                outb[2] = (byte)uVar13;
                bVar9 = bVar9 & 3 | 0xdc;
                lVar8 = 4;
                lVar7 = 3;
                goto LAB_0012cbd6;
              }
            }
LAB_0012cb5b:
            if (iVar3 != 0) {
              if (iVar3 != 3) {
                if (iVar3 != 4) {
                  return iVar1;
                }
                goto LAB_0012cc05;
              }
              break;
            }
          }
          else {
            if (pbVar2 <= outb) goto LAB_0012cc05;
            *outb = bVar9;
            outb[1] = 0;
            in = in + 1;
            outb = outb + 2;
          }
        } while (in < pbVar6);
      }
      iVar1 = (int)outb - iVar4;
LAB_0012cc05:
      *outlen = (int)outb - iVar4;
      iVar5 = (int)in - iVar5;
    }
    *inlen = iVar5;
  }
  return iVar1;
}

Assistant:

static int
UTF8ToUTF16(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen,
            void *vctxt ATTRIBUTE_UNUSED) {
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(outb, outlen, in, inlen, NULL));
}